

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_icc.c
# Opt level: O0

int jas_iccputtime(jas_stream_t *out,jas_icctime_t *time)

{
  jas_icctime_t *time_local;
  jas_stream_t *out_local;
  
  jas_iccputuint(out,2,time->year);
  jas_iccputuint(out,2,time->month);
  jas_iccputuint(out,2,time->day);
  jas_iccputuint(out,2,time->hour);
  jas_iccputuint(out,2,time->min);
  jas_iccputuint(out,2,time->sec);
  return 0;
}

Assistant:

static int jas_iccputtime(jas_stream_t *out, jas_icctime_t *time)
{
	jas_iccputuint16(out, time->year);
	jas_iccputuint16(out, time->month);
	jas_iccputuint16(out, time->day);
	jas_iccputuint16(out, time->hour);
	jas_iccputuint16(out, time->min);
	jas_iccputuint16(out, time->sec);
	return 0;
}